

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,char *directory,string *fullName)

{
  RegularExpression *this_00;
  bool bVar1;
  mapped_type this_01;
  mapped_type *ppcVar2;
  iterator iVar3;
  string *__return_storage_ptr__;
  allocator local_109;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_108;
  UnscannedEntry entry;
  string line;
  string local_70;
  string local_50;
  
  this_01 = (mapped_type)operator_new(0x20);
  (this_01->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01->Used = true;
  ppcVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
            ::operator[](&this->FileCache,fullName);
  *ppcVar2 = this_01;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = &this->IncludeRegexLine;
  local_108 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->Encountered;
  do {
    do {
      bVar1 = cmsys::SystemTools::GetLineFromStream(is,&line,(bool *)0x0,-1);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&line);
        return;
      }
      if ((this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        TransformLine(this,&line);
      }
      bVar1 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p);
    } while (!bVar1);
    entry.FileName._M_dataplus._M_p = (pointer)&entry.FileName.field_2;
    entry.FileName._M_string_length = 0;
    entry.FileName.field_2._M_local_buf[0] = '\0';
    entry.QuotedLocation._M_dataplus._M_p = (pointer)&entry.QuotedLocation.field_2;
    entry.QuotedLocation._M_string_length = 0;
    entry.QuotedLocation.field_2._M_local_buf[0] = '\0';
    cmsys::RegularExpression::match_abi_cxx11_(&local_70,this_00,2);
    std::__cxx11::string::operator=((string *)&entry,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmsys::SystemTools::ConvertToUnixSlashes(&entry.FileName);
    __return_storage_ptr__ = &local_70;
    cmsys::RegularExpression::match_abi_cxx11_(__return_storage_ptr__,this_00,3);
    bVar1 = std::operator==(__return_storage_ptr__,"\"");
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsFullPath(entry.FileName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_50,directory,&local_109);
        cmSystemTools::CollapseCombinedPath(&local_70,&local_50,&entry.FileName);
        std::__cxx11::string::operator=((string *)&entry.QuotedLocation,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        __return_storage_ptr__ = &local_50;
        goto LAB_0041fb95;
      }
    }
    else {
LAB_0041fb95:
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexScan,entry.FileName._M_dataplus._M_p);
    if (bVar1) {
      std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
      push_back((vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_> *)
                this_01,&entry);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_108,&entry.FileName);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_108,&entry.FileName);
        std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back(&(this->Unscanned).c,&entry);
      }
    }
    UnscannedEntry::~UnscannedEntry(&entry);
  } while( true );
}

Assistant:

void cmDependsC::Scan(std::istream& is, const char* directory,
                      const std::string& fullName)
{
  cmIncludeLines* newCacheEntry = new cmIncludeLines;
  newCacheEntry->Used = true;
  this->FileCache[fullName] = newCacheEntry;

  // Read one line at a time.
  std::string line;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    // Transform the line content first.
    if (!this->TransformRules.empty()) {
      this->TransformLine(line);
    }

    // Match include directives.
    if (this->IncludeRegexLine.find(line.c_str())) {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if (this->IncludeRegexLine.match(3) == "\"" &&
          !cmSystemTools::FileIsFullPath(entry.FileName.c_str())) {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseCombinedPath(directory, entry.FileName);
      }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName.c_str())) {
        newCacheEntry->UnscannedEntries.push_back(entry);
        if (this->Encountered.find(entry.FileName) ==
            this->Encountered.end()) {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
        }
      }
    }
  }
}